

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall Imf_2_5::DwaCompressor::initializeDefaultChannelRules(DwaCompressor *this)

{
  string *suffix;
  char *__s;
  value_type *__x;
  long in_RDI;
  value_type *in_stack_fffffffffffff9c8;
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  *in_stack_fffffffffffff9d0;
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  *this_00;
  allocator<char> *in_stack_fffffffffffffa00;
  allocator<char> *__a;
  char *in_stack_fffffffffffffa08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_stack_fffffffffffffa18;
  Classifier *in_stack_fffffffffffffa20;
  Classifier *this_02;
  undefined1 local_539 [88];
  allocator<char> local_4e1;
  string local_4e0 [87];
  allocator<char> local_489;
  string local_488 [87];
  allocator<char> local_431;
  string local_430 [87];
  undefined1 local_3d9 [88];
  undefined1 local_381 [88];
  allocator<char> local_329;
  string local_328 [87];
  allocator<char> local_2d1;
  string local_2d0 [87];
  allocator<char> local_279;
  string local_278 [87];
  allocator<char> local_221;
  string local_220 [87];
  allocator<char> local_1c9;
  string local_1c8 [87];
  allocator<char> local_171;
  string local_170 [87];
  allocator<char> local_119;
  string local_118 [87];
  allocator<char> local_c1;
  string local_c0 [103];
  allocator<char> local_59;
  string local_58 [88];
  
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  clear((vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
         *)0x883223);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  Classifier::Classifier
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             (CompressorScheme)((ulong)in_stack_fffffffffffffa10 >> 0x20),
             (PixelType)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa08 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x88329e);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  Classifier::Classifier
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             (CompressorScheme)((ulong)in_stack_fffffffffffffa10 >> 0x20),
             (PixelType)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa08 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x88334c);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  Classifier::Classifier
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             (CompressorScheme)((ulong)in_stack_fffffffffffffa10 >> 0x20),
             (PixelType)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa08 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x8833f9);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  Classifier::Classifier
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             (CompressorScheme)((ulong)in_stack_fffffffffffffa10 >> 0x20),
             (PixelType)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa08 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x8834a8);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  Classifier::Classifier
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             (CompressorScheme)((ulong)in_stack_fffffffffffffa10 >> 0x20),
             (PixelType)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa08 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x883556);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  Classifier::Classifier
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             (CompressorScheme)((ulong)in_stack_fffffffffffffa10 >> 0x20),
             (PixelType)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa08 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x883605);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  Classifier::Classifier
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             (CompressorScheme)((ulong)in_stack_fffffffffffffa10 >> 0x20),
             (PixelType)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa08 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x8836b3);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  Classifier::Classifier
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             (CompressorScheme)((ulong)in_stack_fffffffffffffa10 >> 0x20),
             (PixelType)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa08 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x883758);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  Classifier::Classifier
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             (CompressorScheme)((ulong)in_stack_fffffffffffffa10 >> 0x20),
             (PixelType)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa08 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x8837fa);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  suffix = (string *)(in_RDI + 0x90);
  this_02 = (Classifier *)local_381;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)in_stack_fffffffffffffa10 >> 0x20),
             (PixelType)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa08 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x88389f);
  std::__cxx11::string::~string((string *)(local_381 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_381);
  __s = (char *)(in_RDI + 0x90);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_fffffffffffffa00);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)this_01 >> 0x20),(PixelType)this_01,
             (int)((ulong)__s >> 0x20),SUB81((ulong)__s >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x883941);
  std::__cxx11::string::~string((string *)(local_3d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3d9);
  __a = &local_431;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)this_01 >> 0x20),(PixelType)this_01,
             (int)((ulong)__s >> 0x20),SUB81((ulong)__s >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x8839e6);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)this_01 >> 0x20),(PixelType)this_01,
             (int)((ulong)__s >> 0x20),SUB81((ulong)__s >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x883a89);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)this_01 >> 0x20),(PixelType)this_01,
             (int)((ulong)__s >> 0x20),SUB81((ulong)__s >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  Classifier::~Classifier((Classifier *)0x883b2e);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  __x = (value_type *)(in_RDI + 0x90);
  this_00 = (vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
             *)local_539;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)this_01 >> 0x20),(PixelType)this_01,
             (int)((ulong)__s >> 0x20),SUB81((ulong)__s >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(this_00,__x);
  Classifier::~Classifier((Classifier *)0x883bce);
  std::__cxx11::string::~string((string *)(local_539 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_539);
  return;
}

Assistant:

void
DwaCompressor::initializeDefaultChannelRules ()
{
    _channelRules.clear();

    _channelRules.push_back (Classifier ("R",     LOSSY_DCT, HALF,   0, false));
    _channelRules.push_back (Classifier ("R",     LOSSY_DCT, FLOAT,  0, false));
    _channelRules.push_back (Classifier ("G",     LOSSY_DCT, HALF,   1, false));
    _channelRules.push_back (Classifier ("G",     LOSSY_DCT, FLOAT,  1, false));
    _channelRules.push_back (Classifier ("B",     LOSSY_DCT, HALF,   2, false));
    _channelRules.push_back (Classifier ("B",     LOSSY_DCT, FLOAT,  2, false));

    _channelRules.push_back (Classifier ("Y",     LOSSY_DCT, HALF,  -1, false));
    _channelRules.push_back (Classifier ("Y",     LOSSY_DCT, FLOAT, -1, false));
    _channelRules.push_back (Classifier ("BY",    LOSSY_DCT, HALF,  -1, false));
    _channelRules.push_back (Classifier ("BY",    LOSSY_DCT, FLOAT, -1, false));
    _channelRules.push_back (Classifier ("RY",    LOSSY_DCT, HALF,  -1, false));
    _channelRules.push_back (Classifier ("RY",    LOSSY_DCT, FLOAT, -1, false));

    _channelRules.push_back (Classifier ("A",     RLE,       UINT,  -1, false));
    _channelRules.push_back (Classifier ("A",     RLE,       HALF,  -1, false));
    _channelRules.push_back (Classifier ("A",     RLE,       FLOAT, -1, false));
}